

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * __thiscall Util::getIndent_abi_cxx11_(string *__return_storage_ptr__,Util *this,int level)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  int i;
  int iVar4;
  int level_local;
  string tmp;
  
  level_local = (int)this;
  paVar1 = &tmp.field_2;
  tmp._M_string_length = 0;
  tmp.field_2._M_local_buf[0] = '\0';
  tmp._M_dataplus._M_p = (pointer)paVar1;
  sVar2 = std::
          _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::count(&indentCache_abi_cxx11_._M_h,&level_local);
  if (sVar2 == 0) {
    for (iVar4 = 0; iVar4 < level_local; iVar4 = iVar4 + 1) {
      std::__cxx11::string::push_back((char)&tmp);
    }
    pmVar3 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&indentCache_abi_cxx11_,&level_local);
    std::__cxx11::string::_M_assign((string *)pmVar3);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tmp._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(tmp.field_2._M_allocated_capacity._1_7_,tmp.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = tmp.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = tmp._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(tmp.field_2._M_allocated_capacity._1_7_,tmp.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = tmp._M_string_length;
    tmp._M_string_length = 0;
    tmp.field_2._M_local_buf[0] = '\0';
    tmp._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    pmVar3 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&indentCache_abi_cxx11_,&level_local);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar3);
  }
  std::__cxx11::string::~string((string *)&tmp);
  return __return_storage_ptr__;
}

Assistant:

std::string Util::getIndent(int level)
{
	std::string tmp;

	if (indentCache.count(level) > 0)
		return indentCache[level];

	for (int i = 0; i < level; i++)
		tmp += '\t';

	indentCache[level] = tmp;

	return tmp;
}